

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void av1_fdwt8x8_uint8_input_c(uint8_t *input,tran_low_t *output,int stride,int hbd)

{
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  uint uVar13;
  tran_low_t *ptVar14;
  int *piVar15;
  int *piVar16;
  tran_low_t *ptVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int *piVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  int *piVar25;
  ulong uVar26;
  uint uVar27;
  tran_low_t buffer [128];
  int local_238 [130];
  
  if (hbd == 0) {
    lVar19 = 0;
    ptVar14 = output;
    do {
      lVar9 = 0;
      do {
        ptVar14[lVar9] = (uint)input[lVar9] << 2;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      lVar19 = lVar19 + 1;
      ptVar14 = ptVar14 + 8;
      input = input + stride;
    } while (lVar19 != 8);
  }
  else {
    lVar19 = (long)input * 2;
    lVar9 = 0;
    ptVar14 = output;
    do {
      lVar20 = 0;
      do {
        uVar10 = *(ulong *)(lVar19 + lVar20 * 2);
        auVar3._8_4_ = 0;
        auVar3._0_8_ = uVar10;
        auVar3._12_2_ = (short)(uVar10 >> 0x30);
        auVar4._8_2_ = (short)(uVar10 >> 0x20);
        auVar4._0_8_ = uVar10;
        auVar4._10_4_ = auVar3._10_4_;
        auVar6._6_8_ = 0;
        auVar6._0_6_ = auVar4._8_6_;
        auVar5._4_2_ = (short)(uVar10 >> 0x10);
        auVar5._0_4_ = (uint)uVar10;
        auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
        ptVar17 = ptVar14 + lVar20;
        *ptVar17 = ((uint)uVar10 & 0xffff) << 2;
        ptVar17[1] = auVar5._4_4_ << 2;
        ptVar17[2] = auVar4._8_4_ << 2;
        ptVar17[3] = (auVar3._10_4_ >> 0x10) << 2;
        lVar20 = lVar20 + 4;
      } while (lVar20 != 8);
      lVar9 = lVar9 + 1;
      lVar19 = lVar19 + (long)stride * 2;
      ptVar14 = ptVar14 + 8;
    } while (lVar9 != 8);
  }
  uVar10 = 4;
  uVar13 = 8;
  uVar7 = 4;
  uVar27 = 8;
  while( true ) {
    uVar11 = 1;
    if (1 < uVar27) {
      uVar11 = (ulong)uVar27;
    }
    iVar1 = (uVar13 >> 1) - 1;
    ptVar14 = output + uVar7;
    uVar26 = 0;
    ptVar17 = output;
    do {
      piVar25 = output + uVar26 * 8;
      memcpy(local_238,piVar25,(ulong)uVar13 * 4);
      piVar12 = piVar25 + uVar7;
      if (iVar1 == 0) {
        piVar15 = local_238;
        piVar16 = piVar12;
        iVar22 = local_238[0];
      }
      else {
        lVar19 = 0;
        piVar15 = local_238;
        iVar8 = local_238[0];
        iVar18 = iVar1;
        do {
          *(int *)((long)ptVar17 + lVar19) = iVar8 * 2;
          piVar15 = piVar15 + 2;
          iVar22 = *(int *)((long)local_238 + lVar19 * 2 + 8);
          *(int *)((long)ptVar14 + lVar19) =
               *(int *)((long)local_238 + lVar19 * 2 + 4) - (iVar8 + iVar22 + 1 >> 1);
          lVar19 = lVar19 + 4;
          iVar18 = iVar18 + -1;
          iVar8 = iVar22;
        } while (iVar18 != 0);
        piVar25 = (int *)(lVar19 + (long)ptVar17);
        piVar16 = (int *)((long)ptVar14 + lVar19);
      }
      *piVar25 = iVar22 * 2;
      *piVar16 = piVar15[1] - iVar22;
      lVar19 = 0;
      piVar25 = piVar12;
      do {
        piVar15 = piVar12;
        ptVar17[lVar19] = ptVar17[lVar19] + (*piVar25 + *piVar15 + 1 >> 1);
        lVar19 = lVar19 + 1;
        piVar12 = piVar15 + 1;
        piVar25 = piVar15;
      } while (uVar13 >> 1 != (uint)lVar19);
      uVar26 = uVar26 + 1;
      ptVar14 = ptVar14 + 8;
      ptVar17 = ptVar17 + 8;
    } while (uVar26 != uVar11);
    uVar11 = (ulong)uVar27;
    piVar12 = local_238 + uVar11;
    uVar24 = (uint)uVar10;
    piVar25 = local_238 + uVar10;
    iVar1 = (uVar27 >> 1) - 1;
    uVar26 = 0;
    ptVar14 = output;
    do {
      uVar23 = 0;
      piVar15 = ptVar14;
      do {
        piVar12[uVar23] = *piVar15;
        uVar23 = uVar23 + 1;
        piVar15 = piVar15 + 8;
      } while (uVar11 != uVar23);
      piVar16 = local_238;
      piVar21 = piVar12;
      piVar15 = piVar25;
      iVar22 = iVar1;
      if (iVar1 != 0) {
        do {
          iVar18 = *piVar21;
          *piVar16 = iVar18;
          piVar16[uVar10] = (piVar21[1] * 2 - (iVar18 + piVar21[2])) + 2 >> 2;
          piVar16 = piVar16 + 1;
          piVar21 = piVar21 + 2;
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
        piVar15 = piVar16 + uVar10;
      }
      iVar22 = *piVar21;
      *piVar16 = iVar22;
      *piVar15 = (piVar21[1] - iVar22) + 1 >> 1;
      lVar19 = 0;
      piVar15 = piVar25;
      piVar16 = piVar25;
      do {
        piVar21 = piVar15;
        local_238[lVar19] = local_238[lVar19] + (*piVar16 + *piVar21 + 1 >> 1);
        lVar19 = lVar19 + 1;
        piVar15 = piVar21 + 1;
        piVar16 = piVar21;
      } while (uVar27 >> 1 != (uint)lVar19);
      lVar19 = 0;
      uVar23 = uVar11;
      do {
        ptVar14[lVar19 * 2] = *(int *)((long)local_238 + lVar19);
        lVar19 = lVar19 + 4;
        uVar23 = uVar23 - 1;
      } while (uVar23 != 0);
      uVar26 = uVar26 + 1;
      ptVar14 = ptVar14 + 1;
    } while (uVar26 != uVar13);
    if (uVar24 < 2) break;
    uVar10 = (ulong)(uVar24 + 1 >> 1);
    bVar2 = uVar7 < 2;
    uVar13 = uVar7;
    uVar7 = uVar7 + 1 >> 1;
    uVar27 = uVar24;
    if (bVar2) {
      return;
    }
  }
  return;
}

Assistant:

static void dyadic_analyze_53_uint8_input(int levels, int width, int height,
                                          const uint8_t *x, int pitch_x,
                                          tran_low_t *c, int pitch_c,
                                          int dwt_scale_bits, int hbd) {
  int lv, i, j, nh, nw, hh = height, hw = width;
  tran_low_t buffer[2 * DWT_MAX_LENGTH];

  if (hbd) {
    const uint16_t *x16 = CONVERT_TO_SHORTPTR(x);
    for (i = 0; i < height; i++) {
      for (j = 0; j < width; j++) {
        c[i * pitch_c + j] = x16[i * pitch_x + j] << dwt_scale_bits;
      }
    }
  } else {
    for (i = 0; i < height; i++) {
      for (j = 0; j < width; j++) {
        c[i * pitch_c + j] = x[i * pitch_x + j] << dwt_scale_bits;
      }
    }
  }

  for (lv = 0; lv < levels; lv++) {
    nh = hh;
    hh = (hh + 1) >> 1;
    nw = hw;
    hw = (hw + 1) >> 1;
    if ((nh < 2) || (nw < 2)) return;
    for (i = 0; i < nh; i++) {
      memcpy(buffer, &c[i * pitch_c], nw * sizeof(tran_low_t));
      analysis_53_row(nw, buffer, &c[i * pitch_c], &c[i * pitch_c] + hw);
    }
    for (j = 0; j < nw; j++) {
      for (i = 0; i < nh; i++) buffer[i + nh] = c[i * pitch_c + j];
      analysis_53_col(nh, buffer + nh, buffer, buffer + hh);
      for (i = 0; i < nh; i++) c[i * pitch_c + j] = buffer[i];
    }
  }
}